

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

ArrayPtr<const_capnp::word> __thiscall
capnp::FlatArrayMessageReader::checkAlignment
          (FlatArrayMessageReader *this,ArrayPtr<const_capnp::word> array)

{
  ArrayPtr<const_capnp::word> AVar1;
  word *pwVar2;
  Fault local_30;
  Fault f;
  ArrayPtr<const_capnp::word> array_local;
  
  f.exception = (Exception *)this;
  pwVar2 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)&f);
  if (((ulong)pwVar2 & 7) == 0) {
    AVar1.size_ = (size_t)array.ptr;
    AVar1.ptr = (word *)f.exception;
    return AVar1;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[209]>
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
             ,0x73,FAILED,"(uintptr_t)array.begin() % sizeof(void*) == 0",
             "\"Input to FlatArrayMessageReader is not aligned. If your architecture supports unaligned \" \"access (e.g. x86/x64/modern ARM), you may use UnalignedFlatArrayMessageReader instead, \" \"though this may harm performance.\""
             ,(char (*) [209])
              "Input to FlatArrayMessageReader is not aligned. If your architecture supports unaligned access (e.g. x86/x64/modern ARM), you may use UnalignedFlatArrayMessageReader instead, though this may harm performance."
            );
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

kj::ArrayPtr<const word> FlatArrayMessageReader::checkAlignment(kj::ArrayPtr<const word> array) {
  KJ_REQUIRE((uintptr_t)array.begin() % sizeof(void*) == 0,
      "Input to FlatArrayMessageReader is not aligned. If your architecture supports unaligned "
      "access (e.g. x86/x64/modern ARM), you may use UnalignedFlatArrayMessageReader instead, "
      "though this may harm performance.");

  return array;
}